

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

bool __thiscall Timidity::GF1Envelope::Recompute(GF1Envelope *this,Voice *v)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int newstage;
  Voice *v_local;
  GF1Envelope *this_local;
  
  bVar1 = (this->super_MinEnvelope).stage;
  uVar3 = (uint)bVar1;
  if (uVar3 < 6) {
    if (((uVar3 == 3) && ((v->status & 4) == 0)) && ((v->sample->modes & 0x20) != 0)) {
      v->status = v->status | 2;
      this->increment = 0;
      (this->super_MinEnvelope).bUpdating = '\0';
    }
    else {
      (this->super_MinEnvelope).stage = bVar1 + 1;
      if (this->volume == this->offset[(int)uVar3]) {
        bVar2 = Recompute(this,v);
        return bVar2;
      }
      this->target = this->offset[(int)uVar3];
      this->increment = this->rate[(int)uVar3];
      if (this->target < this->volume) {
        this->increment = -this->increment;
      }
    }
  }
  else {
    this->increment = 0;
    (this->super_MinEnvelope).bUpdating = '\0';
    v->status = v->status & 0xed;
    v->status = v->status | 4;
  }
  return false;
}

Assistant:

bool GF1Envelope::Recompute(Voice *v)
{
	int newstage;

	newstage = stage;

	if (newstage > GF1_RELEASEC)
	{
		/* Envelope ran out. */
		increment = 0;
		bUpdating = false;
		v->status &= ~(VOICE_SUSTAINING | VOICE_LPE);
		v->status |= VOICE_RELEASING;
		/* play sampled release */
		return 0;
	}

	if (newstage == GF1_RELEASE && !(v->status & VOICE_RELEASING) && (v->sample->modes & PATCH_SUSTAIN))
	{
		v->status |= VOICE_SUSTAINING;
		/* Freeze envelope until note turns off. Trumpets want this. */
		increment = 0;
		bUpdating = false;
	}
	else
	{
		stage = newstage + 1;

		if (volume == offset[newstage])
		{
			return Recompute(v);
		}
		target = offset[newstage];
		increment = rate[newstage];
		if (target < volume)
			increment = -increment;
	}

	return 0;
}